

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# createConstants.cpp
# Opt level: O3

void createConstantsForOperands(User *ins,Program *program)

{
  uint uVar1;
  Value *value;
  Expr *pEVar2;
  ulong uVar3;
  long lVar4;
  User *ins_00;
  
  uVar1 = *(uint *)(ins + 0x14);
  if ((uVar1 >> 0x1e & 1) == 0) {
    lVar4 = (long)ins - (ulong)(uVar1 << 5);
  }
  else {
    lVar4 = *(long *)(ins + -8);
  }
  if ((uVar1 & 0x7ffffff) != 0) {
    uVar3 = 0;
    do {
      ins_00 = *(User **)(lVar4 + uVar3);
      if (ins_00[0x10] != (User)0x3) {
        if ((byte)ins_00[0x10] < 0x14) {
          createConstantsForOperands(ins_00,program);
          ins_00 = *(User **)(lVar4 + uVar3);
          if (ins_00 == (User *)0x0) goto LAB_0014f05c;
        }
        if ((byte)((Value *)ins_00)[0x10] < 0x14) {
          pEVar2 = Program::getExpr(program,(Value *)ins_00);
          if (pEVar2 == (Expr *)0x0) {
            value = *(Value **)(lVar4 + uVar3);
            pEVar2 = createConstantValue((Value *)ins_00,program);
            Program::addExpr(program,value,pEVar2);
          }
        }
      }
LAB_0014f05c:
      uVar3 = uVar3 + 0x20;
    } while ((uVar1 & 0x7ffffff) << 5 != uVar3);
  }
  return;
}

Assistant:

static void createConstantsForOperands(const llvm::User* ins, Program& program) {
    for (const auto& op : ins->operands()) {

        // assumption: the GV that is an operand of this has already been initialized
        // reason: pass ComputeGlobalVarsOrder has been completed
        if (llvm::isa<llvm::GlobalVariable>(op.get()))
            continue;

        if (auto *user = llvm::dyn_cast_or_null<llvm::User>(op.get())) {
            if (!llvm::isa<llvm::Instruction>(user))
                createConstantsForOperands(user, program);
        }

        if (auto C = llvm::dyn_cast_or_null<llvm::Constant>(op.get())) {
            if (program.getExpr(op.get()) == nullptr)
                program.addExpr(op.get(), createConstantValue(C, program));
        }

    }
}